

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * Pathie::Path::global_runtime_dir(Path *__return_storage_ptr__,localpathtype local)

{
  bool bVar1;
  Path run;
  string local_98;
  string local_78;
  Path local_58;
  string local_38;
  
  if ((local == LOCALPATH_LOCAL) ||
     ((local == LOCALPATH_DEFAULT && (c_localdefault == LOCALPATH_LOCAL)))) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/var/local/run","");
    Path(__return_storage_ptr__,&local_38);
    local_58.m_path._M_dataplus._M_p = local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/run","");
    Path(&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    bVar1 = exists(&local_58);
    if (bVar1) {
      Path(__return_storage_ptr__,&local_58);
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/var/run","");
      Path(__return_storage_ptr__,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.m_path._M_dataplus._M_p == &local_58.m_path.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_58.m_path._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_runtime_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
  if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/run");

  Path run("/run");
  if (run.exists())
    return run;
  else
    return Path("/var/run");
#elif defined(_WIN32)
  return Path("C:/Temp");
#else
#error Unsupported system.
#endif
}